

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
          (sysbvm_context_t *context,char *symbolString,sysbvm_tuple_t ownerClass,
          char *selectorString,size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_tuple_t method;
  sysbvm_tuple_t selector;
  undefined1 local_78 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_ae8be5de gcFrame;
  sysbvm_bitflags_t flags_local;
  size_t argumentCount_local;
  char *selectorString_local;
  sysbvm_tuple_t ownerClass_local;
  char *symbolString_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x20);
  memset(local_78,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_78);
  method = sysbvm_function_createPrimitive(context,argumentCount,flags,userdata,entryPoint);
  if (selectorString != (char *)0x0) {
    selector = sysbvm_symbol_internWithCString(context,selectorString);
    sysbvm_type_setMethodWithSelector(context,ownerClass,selector,method);
  }
  if (symbolString != (char *)0x0) {
    gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_symbol_internWithCString(context,symbolString);
    sysbvm_context_setIntrinsicSymbolBindingValue
              (context,(sysbvm_tuple_t)gcFrameRecord.roots,method);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_78);
  return method;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(sysbvm_context_t *context, const char *symbolString, sysbvm_tuple_t ownerClass, const char *selectorString, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    struct {
        sysbvm_tuple_t symbol;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t primitiveFunction;
        sysbvm_tuple_t ownerClass;
    } gcFrame = {
        .ownerClass = ownerClass
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.primitiveFunction = sysbvm_function_createPrimitive(context, argumentCount, flags, userdata, entryPoint);
    if(selectorString)
    {
        gcFrame.selector = sysbvm_symbol_internWithCString(context, selectorString);
        sysbvm_type_setMethodWithSelector(context, gcFrame.ownerClass, gcFrame.selector, gcFrame.primitiveFunction);
    }

    if(symbolString)
    {
        gcFrame.symbol = sysbvm_symbol_internWithCString(context, symbolString);
        sysbvm_context_setIntrinsicSymbolBindingValue(context, gcFrame.symbol, gcFrame.primitiveFunction);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.primitiveFunction;
}